

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Delaunay3dThread::check_geometry(Delaunay3dThread *this,bool verbose)

{
  uint uVar1;
  signed_index_t sVar2;
  bool bVar3;
  index_t iVar4;
  double *p;
  ostream *poVar5;
  void *this_00;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  index_t local_30;
  uint local_2c;
  signed_index_t sv;
  index_t v;
  signed_index_t v3;
  signed_index_t v2;
  signed_index_t v1;
  signed_index_t v0;
  index_t t;
  bool ok;
  bool verbose_local;
  Delaunay3dThread *this_local;
  
  v0._2_1_ = 1;
  v0._3_1_ = verbose;
  _t = this;
  for (v1 = 0; sVar2 = v1, iVar4 = max_t(this), (uint)sVar2 < iVar4; v1 = v1 + 1) {
    bVar3 = tet_is_free(this,v1);
    if (!bVar3) {
      v2 = tet_vertex(this,v1,0);
      v3 = tet_vertex(this,v1,1);
      v = tet_vertex(this,v1,2);
      sv = tet_vertex(this,v1,3);
      for (local_2c = 0; uVar1 = local_2c, iVar4 = nb_vertices(this), sVar2 = v1, uVar1 < iVar4;
          local_2c = local_2c + 1) {
        local_30 = local_2c;
        if ((((local_2c != v2) && (local_2c != v3)) && (local_2c != v)) && (local_2c != sv)) {
          p = vertex_ptr(this,local_2c);
          bVar3 = tet_is_in_conflict(this,sVar2,p);
          if ((bVar3) && (v0._2_1_ = 0, (v0._3_1_ & 1) != 0)) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Tet ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,v1);
            poVar5 = std::operator<<(poVar5," is in conflict with vertex ");
            this_00 = (void *)std::ostream::operator<<(poVar5,local_2c);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            std::operator<<((ostream *)&std::cerr,"  offending tet: ");
            show_tet(this,v1);
          }
        }
      }
    }
  }
  if ((v0._2_1_ & 1) != 0) {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Delaunay Geo OK");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ok",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_89);
  geo_assertion_failed((string *)local_50,(string *)local_88,0x685e);
}

Assistant:

void check_geometry(bool verbose) const {
            bool ok = true;
            for(index_t t = 0; t < max_t(); ++t) {
                if(!tet_is_free(t)) {
                    signed_index_t v0 = tet_vertex(t, 0);
                    signed_index_t v1 = tet_vertex(t, 1);
                    signed_index_t v2 = tet_vertex(t, 2);
                    signed_index_t v3 = tet_vertex(t, 3);
                    for(index_t v = 0; v < nb_vertices(); ++v) {
                        signed_index_t sv = signed_index_t(v);
                        if(sv == v0 || sv == v1 || sv == v2 || sv == v3) {
                            continue;
                        }
                        if(tet_is_in_conflict(t, vertex_ptr(v))) {
                            ok = false;
                            if(verbose) {
                                std::cerr << "Tet " << t <<
                                    " is in conflict with vertex " << v
                                          << std::endl;
                                
                                std::cerr << "  offending tet: ";
                                show_tet(t);
                            }
                        }
                    }
                }
            }
            geo_assert(ok);
            std::cerr << std::endl << "Delaunay Geo OK" << std::endl;
        }